

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O0

bool __thiscall cppnet::CppNetBase::ListenAndAccept(CppNetBase *this,string *ip,uint16_t port)

{
  bool ipv4;
  size_type sVar1;
  uint64_t sock;
  SingletonLogger *this_00;
  __shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  SysCallInt64Result SVar2;
  SysCallInt64Result ret;
  size_t i;
  uint16_t port_local;
  string *ip_local;
  CppNetBase *this_local;
  
  ret._errno = 0;
  ret._12_4_ = 0;
  while( true ) {
    sVar1 = std::
            vector<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
            ::size(&this->_dispatchers);
    if (sVar1 <= (ulong)ret._8_8_) {
      return true;
    }
    ipv4 = Address::IsIpv4(ip);
    SVar2 = OsHandle::TcpSocket(ipv4);
    sock = SVar2._return_value;
    if ((long)sock < 0) break;
    ReusePort(sock);
    this_01 = (__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
              ::operator[](&this->_dispatchers,ret._8_8_);
    this_02 = std::__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_01);
    Dispatcher::Listen(this_02,sock,ip,port);
    ret._8_8_ = ret._8_8_ + 1;
  }
  this_00 = Singleton<cppnet::SingletonLogger>::Instance();
  SingletonLogger::Error
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/cppnet_base.cpp"
             ,0x61,"create socket failed. err:%d",(ulong)(uint)SVar2._errno);
  return false;
}

Assistant:

bool CppNetBase::ListenAndAccept(const std::string& ip, uint16_t port) {
#ifdef __win__ // WEPOLL don't support reuse_port
    auto ret = OsHandle::TcpSocket(Address::IsIpv4(ip));
    if (ret._return_value < 0) {
        LOG_ERROR("create socket failed. err:%d", ret._errno);
        return false;
    }
    for (size_t i = 0; i < _dispatchers.size(); i++) {
        _dispatchers[i]->Listen(ret._return_value, ip, port);
    }
#else
    if (__reuse_port) {
        for (size_t i = 0; i < _dispatchers.size(); i++) {
            auto ret = OsHandle::TcpSocket(Address::IsIpv4(ip));
            if (ret._return_value < 0) {
                LOG_ERROR("create socket failed. err:%d", ret._errno);
                return false;
            }
            ReusePort(ret._return_value);
            _dispatchers[i]->Listen(ret._return_value, ip, port);
        }

    } else {
        auto ret = OsHandle::TcpSocket(Address::IsIpv4(ip));
        if (ret._return_value < 0) {
            LOG_ERROR("create socket failed. err:%d", ret._errno);
            return false;
        }
        for (size_t i = 0; i < _dispatchers.size(); i++) {
            _dispatchers[i]->Listen(ret._return_value, ip, port);
        }
    }
#endif
    return true;
}